

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TripWireTests.cpp
# Opt level: O0

void __thiscall tripwire_indexed_Test::~tripwire_indexed_Test(tripwire_indexed_Test *this)

{
  tripwire_indexed_Test *this_local;
  
  ~tripwire_indexed_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(tripwire, indexed)
{
    TripWireDetector detect(5);

    EXPECT_FALSE(detect.isTripped());

    EXPECT_THROW(TripWireDetector(12), std::out_of_range);
    // smaller scope for trigger
    {
        TripWireTrigger trig(5);
        EXPECT_FALSE(detect.isTripped());
    }
    EXPECT_TRUE(detect.isTripped());
}